

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APIDataBlobSourceGetName(hrgls_APIDataBlobSourceInfo info,char **returnName)

{
  char *pcVar1;
  hrgls_Status s;
  char **returnName_local;
  hrgls_APIDataBlobSourceInfo info_local;
  
  if (info == (hrgls_APIDataBlobSourceInfo)0x0) {
    info_local._4_4_ = 0x3ee;
  }
  else if (returnName == (char **)0x0) {
    info_local._4_4_ = 0x3e9;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    *returnName = pcVar1;
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APIDataBlobSourceGetName(
    hrgls_APIDataBlobSourceInfo info, const char **returnName)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!info) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnName) {
      return hrgls_STATUS_BAD_PARAMETER;
    }

    *returnName = info->name.c_str();
    return s;
  }